

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

UChar32 u_unescapeAt_63(UNESCAPE_CHAR_AT charAt,int32_t *offset,int32_t length,void *context)

{
  int iVar1;
  short sVar2;
  ushort uVar3;
  UChar32 UVar4;
  char local_5a;
  int local_50;
  UChar c2_1;
  UChar c2;
  int32_t ahead;
  UBool braces;
  int32_t i;
  uint uStack_3c;
  int8_t dig;
  int8_t bitsPerDigit;
  int8_t maxDig;
  int8_t minDig;
  int8_t n;
  UChar32 result;
  UChar c;
  void *pvStack_30;
  int32_t start;
  void *context_local;
  int32_t *piStack_20;
  int32_t length_local;
  int32_t *offset_local;
  UNESCAPE_CHAR_AT charAt_local;
  
  result = *offset;
  uStack_3c = 0;
  i._3_1_ = '\0';
  i._2_1_ = '\0';
  i._1_1_ = '\0';
  i._0_1_ = 4;
  c2._1_1_ = '\0';
  piStack_20 = offset;
  if ((-1 < *offset) && (*offset < length)) {
    iVar1 = *offset;
    *offset = iVar1 + 1;
    pvStack_30 = context;
    context_local._4_4_ = length;
    offset_local = (int32_t *)charAt;
    _minDig = (*charAt)(iVar1,context);
    if (_minDig == L'U') {
      i._1_1_ = '\b';
      i._2_1_ = '\b';
    }
    else if (_minDig == L'u') {
      i._1_1_ = '\x04';
      i._2_1_ = '\x04';
    }
    else if (_minDig == L'x') {
      i._2_1_ = '\x01';
      if ((*piStack_20 < context_local._4_4_) &&
         (sVar2 = (*(code *)offset_local)(*piStack_20,pvStack_30), sVar2 == 0x7b)) {
        *piStack_20 = *piStack_20 + 1;
        c2._1_1_ = '\x01';
        i._1_1_ = '\b';
      }
      else {
        i._1_1_ = '\x02';
      }
    }
    else {
      braces = _digit8(_minDig);
      if (-1 < braces) {
        i._2_1_ = '\x01';
        i._1_1_ = '\x03';
        i._3_1_ = '\x01';
        i._0_1_ = 3;
        uStack_3c = (uint)braces;
      }
    }
    if (i._2_1_ == '\0') {
      for (ahead = 0; ahead < 0x10; ahead = ahead + 2) {
        if (_minDig == L"a\ab\be\x1bf\fn\nr\rt\tv\v"[ahead]) {
          return (uint)(ushort)L"a\ab\be\x1bf\fn\nr\rt\tv\v"[ahead + 1];
        }
        if ((ushort)_minDig < (ushort)L"a\ab\be\x1bf\fn\nr\rt\tv\v"[ahead]) break;
      }
      if ((_minDig == L'c') && (*piStack_20 < context_local._4_4_)) {
        iVar1 = *piStack_20;
        *piStack_20 = iVar1 + 1;
        _minDig = (*(code *)offset_local)(iVar1,pvStack_30);
        if ((((_minDig & 0xfc00U) == 0xd800) && (*piStack_20 < context_local._4_4_)) &&
           (uVar3 = (*(code *)offset_local)(*piStack_20,pvStack_30), (uVar3 & 0xfc00) == 0xdc00)) {
          *piStack_20 = *piStack_20 + 1;
          _minDig = uVar3 + 0x2400;
        }
        return (ushort)_minDig & 0x1f;
      }
      if (((_minDig & 0xfc00U) == 0xd800) &&
         ((*piStack_20 < context_local._4_4_ &&
          (uVar3 = (*(code *)offset_local)(*piStack_20,pvStack_30), (uVar3 & 0xfc00) == 0xdc00)))) {
        *piStack_20 = *piStack_20 + 1;
        return (uint)(ushort)_minDig * 0x400 + (uint)uVar3 + -0x35fdc00;
      }
      return (uint)(ushort)_minDig;
    }
    for (; *piStack_20 < context_local._4_4_ && i._3_1_ < i._1_1_; i._3_1_ = i._3_1_ + '\x01') {
      _minDig = (*(code *)offset_local)(*piStack_20,pvStack_30);
      if ((byte)i == 3) {
        local_5a = _digit8(_minDig);
      }
      else {
        local_5a = _digit16(_minDig);
      }
      braces = local_5a;
      if (local_5a < '\0') break;
      uStack_3c = uStack_3c << ((byte)i & 0x1f) | (int)local_5a;
      *piStack_20 = *piStack_20 + 1;
    }
    if (i._2_1_ <= i._3_1_) {
      if (c2._1_1_ != '\0') {
        if (_minDig != L'}') goto LAB_003e919c;
        *piStack_20 = *piStack_20 + 1;
      }
      if ((-1 < (int)uStack_3c) && ((int)uStack_3c < 0x110000)) {
        if ((*piStack_20 < context_local._4_4_) && ((uStack_3c & 0xfffffc00) == 0xd800)) {
          local_50 = *piStack_20 + 1;
          _minDig = (*(code *)offset_local)(*piStack_20,pvStack_30);
          if ((_minDig == 0x5c) && (local_50 < context_local._4_4_)) {
            UVar4 = u_unescapeAt_63((UNESCAPE_CHAR_AT)offset_local,&local_50,context_local._4_4_,
                                    pvStack_30);
            _minDig = (UChar)UVar4;
          }
          if ((_minDig & 0xfc00U) == 0xdc00) {
            *piStack_20 = local_50;
            uStack_3c = uStack_3c * 0x400 + (uint)(ushort)_minDig + 0xfca02400;
          }
        }
        return uStack_3c;
      }
    }
  }
LAB_003e919c:
  *piStack_20 = result;
  return -1;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
u_unescapeAt(UNESCAPE_CHAR_AT charAt,
             int32_t *offset,
             int32_t length,
             void *context) {

    int32_t start = *offset;
    UChar c;
    UChar32 result = 0;
    int8_t n = 0;
    int8_t minDig = 0;
    int8_t maxDig = 0;
    int8_t bitsPerDigit = 4; 
    int8_t dig;
    int32_t i;
    UBool braces = FALSE;

    /* Check that offset is in range */
    if (*offset < 0 || *offset >= length) {
        goto err;
    }

    /* Fetch first UChar after '\\' */
    c = charAt((*offset)++, context);

    /* Convert hexadecimal and octal escapes */
    switch (c) {
    case 0x0075 /*'u'*/:
        minDig = maxDig = 4;
        break;
    case 0x0055 /*'U'*/:
        minDig = maxDig = 8;
        break;
    case 0x0078 /*'x'*/:
        minDig = 1;
        if (*offset < length && charAt(*offset, context) == 0x7B /*{*/) {
            ++(*offset);
            braces = TRUE;
            maxDig = 8;
        } else {
            maxDig = 2;
        }
        break;
    default:
        dig = _digit8(c);
        if (dig >= 0) {
            minDig = 1;
            maxDig = 3;
            n = 1; /* Already have first octal digit */
            bitsPerDigit = 3;
            result = dig;
        }
        break;
    }
    if (minDig != 0) {
        while (*offset < length && n < maxDig) {
            c = charAt(*offset, context);
            dig = (int8_t)((bitsPerDigit == 3) ? _digit8(c) : _digit16(c));
            if (dig < 0) {
                break;
            }
            result = (result << bitsPerDigit) | dig;
            ++(*offset);
            ++n;
        }
        if (n < minDig) {
            goto err;
        }
        if (braces) {
            if (c != 0x7D /*}*/) {
                goto err;
            }
            ++(*offset);
        }
        if (result < 0 || result >= 0x110000) {
            goto err;
        }
        /* If an escape sequence specifies a lead surrogate, see if
         * there is a trail surrogate after it, either as an escape or
         * as a literal.  If so, join them up into a supplementary.
         */
        if (*offset < length && U16_IS_LEAD(result)) {
            int32_t ahead = *offset + 1;
            c = charAt(*offset, context);
            if (c == 0x5C /*'\\'*/ && ahead < length) {
                c = (UChar) u_unescapeAt(charAt, &ahead, length, context);
            }
            if (U16_IS_TRAIL(c)) {
                *offset = ahead;
                result = U16_GET_SUPPLEMENTARY(result, c);
            }
        }
        return result;
    }

    /* Convert C-style escapes in table */
    for (i=0; i<UNESCAPE_MAP_LENGTH; i+=2) {
        if (c == UNESCAPE_MAP[i]) {
            return UNESCAPE_MAP[i+1];
        } else if (c < UNESCAPE_MAP[i]) {
            break;
        }
    }

    /* Map \cX to control-X: X & 0x1F */
    if (c == 0x0063 /*'c'*/ && *offset < length) {
        c = charAt((*offset)++, context);
        if (U16_IS_LEAD(c) && *offset < length) {
            UChar c2 = charAt(*offset, context);
            if (U16_IS_TRAIL(c2)) {
                ++(*offset);
                c = (UChar) U16_GET_SUPPLEMENTARY(c, c2); /* [sic] */
            }
        }
        return 0x1F & c;
    }

    /* If no special forms are recognized, then consider
     * the backslash to generically escape the next character.
     * Deal with surrogate pairs. */
    if (U16_IS_LEAD(c) && *offset < length) {
        UChar c2 = charAt(*offset, context);
        if (U16_IS_TRAIL(c2)) {
            ++(*offset);
            return U16_GET_SUPPLEMENTARY(c, c2);
        }
    }
    return c;

 err:
    /* Invalid escape sequence */
    *offset = start; /* Reset to initial value */
    return (UChar32)0xFFFFFFFF;
}